

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

double __thiscall
ON_PlaneEquation::MaximumAbsoluteValueAt
          (ON_PlaneEquation *this,bool bRational,int point_count,int point_stride,double *points,
          double stop_value)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double w;
  double max_value;
  double value;
  double stop_value_local;
  double *points_local;
  int local_20;
  int point_stride_local;
  int point_count_local;
  bool bRational_local;
  ON_PlaneEquation *this_local;
  
  if (0 < point_count) {
    iVar2 = 3;
    if (bRational) {
      iVar2 = 4;
    }
    if ((iVar2 <= point_stride) && (points != (double *)0x0)) {
      bVar1 = ON_IsValid(stop_value);
      stop_value_local = (double)points;
      if (bVar1) {
        if (bRational) {
          local_60 = points[3];
          if ((local_60 != 0.0) || (NAN(local_60))) {
            local_60 = 1.0 / local_60;
          }
          else {
            local_60 = 1.0;
          }
          w = ABS(this->z * local_60 * points[2] +
                  this->x * local_60 * *points + this->y * local_60 * points[1] + points[3]);
          if (stop_value < w) {
            return w;
          }
          local_20 = point_count + -1;
          while (iVar2 = local_20 + -1, local_20 != 0) {
            stop_value_local = (double)((long)stop_value_local + (long)point_stride * 8);
            local_68 = *(double *)((long)stop_value_local + 0x18);
            if ((local_68 != 0.0) || (NAN(local_68))) {
              local_68 = 1.0 / local_68;
            }
            else {
              local_68 = 1.0;
            }
            dVar3 = ABS(this->z * local_68 * *(double *)((long)stop_value_local + 0x10) +
                        this->x * local_68 * *(double *)stop_value_local +
                        this->y * local_68 * *(double *)((long)stop_value_local + 8) +
                        *(double *)((long)stop_value_local + 0x18));
            local_20 = iVar2;
            if ((w < dVar3) && (w = dVar3, stop_value < dVar3)) {
              return dVar3;
            }
          }
        }
        else {
          w = ABS(this->z * points[2] + this->x * *points + this->y * points[1] + this->d);
          if (stop_value < w) {
            return w;
          }
          local_20 = point_count + -1;
          while (iVar2 = local_20 + -1, local_20 != 0) {
            stop_value_local = (double)((long)stop_value_local + (long)point_stride * 8);
            dVar3 = ABS(this->z * *(double *)((long)stop_value_local + 0x10) +
                        this->x * *(double *)stop_value_local +
                        this->y * *(double *)((long)stop_value_local + 8) + this->d);
            local_20 = iVar2;
            if ((w < dVar3) && (w = dVar3, stop_value < dVar3)) {
              return dVar3;
            }
          }
        }
      }
      else if (bRational) {
        local_70 = points[3];
        if ((local_70 != 0.0) || (NAN(local_70))) {
          local_70 = 1.0 / local_70;
        }
        else {
          local_70 = 1.0;
        }
        w = ABS(this->z * local_70 * points[2] +
                this->x * local_70 * *points + this->y * local_70 * points[1] + points[3]);
        local_20 = point_count + -1;
        while (iVar2 = local_20 + -1, local_20 != 0) {
          stop_value_local = (double)((long)stop_value_local + (long)point_stride * 8);
          local_78 = *(double *)((long)stop_value_local + 0x18);
          if ((local_78 != 0.0) || (NAN(local_78))) {
            local_78 = 1.0 / local_78;
          }
          else {
            local_78 = 1.0;
          }
          dVar3 = ABS(this->z * local_78 * *(double *)((long)stop_value_local + 0x10) +
                      this->x * local_78 * *(double *)stop_value_local +
                      this->y * local_78 * *(double *)((long)stop_value_local + 8) +
                      *(double *)((long)stop_value_local + 0x18));
          local_20 = iVar2;
          if (w < dVar3) {
            w = dVar3;
          }
        }
      }
      else {
        w = ABS(this->z * points[2] + this->x * *points + this->y * points[1] + this->d);
        local_20 = point_count + -1;
        while (iVar2 = local_20 + -1, local_20 != 0) {
          stop_value_local = (double)((long)stop_value_local + (long)point_stride * 8);
          dVar3 = ABS(this->z * *(double *)((long)stop_value_local + 0x10) +
                      this->x * *(double *)stop_value_local +
                      this->y * *(double *)((long)stop_value_local + 8) + this->d);
          local_20 = iVar2;
          if (w < dVar3) {
            w = dVar3;
          }
        }
      }
      return w;
    }
  }
  return -1.23432101234321e+308;
}

Assistant:

double ON_PlaneEquation::MaximumAbsoluteValueAt(
  bool bRational,
  int point_count,
  int point_stride,
  const double* points,
  double stop_value
  ) const
{
  double value, max_value, w;

  if (    point_count < 1 
       || point_stride < (bRational?4:3) 
       || 0 == points
       )
  {
    return ON_UNSET_VALUE;
  }

  if ( ON_IsValid(stop_value) )
  {
    if ( bRational )
    {
      w = points[3];
      w = (0.0 != w) ? 1.0/w : 1.0;
      max_value = fabs(x*w*points[0]+y*w*points[1]+z*w*points[2]+points[3]);
      if ( max_value > stop_value )
        return max_value;
      for(point_count--; point_count--; /*empty iterator*/ )
      {
        points += point_stride;
        w = points[3];
        w = (0.0 != w) ? 1.0/w : 1.0;
        value = fabs(x*w*points[0]+y*w*points[1]+z*w*points[2]+points[3]);
        if ( value > max_value )
        {
          if ( (max_value = value) > stop_value )
            return max_value;
        }
      }
    }
    else
    {
      max_value = fabs(x*points[0]+y*points[1]+z*points[2]+d);
      if ( max_value > stop_value )
        return max_value;
      for(point_count--; point_count--; /*empty iterator*/ )
      {
        points += point_stride;
        value = fabs(x*points[0]+y*points[1]+z*points[2]+d);
        if ( value > max_value )
        {
          if ( (max_value = value) > stop_value )
            return max_value;
        }
      }
    }
  }
  else
  {
    if ( bRational )
    {
      w = points[3];
      w = (0.0 != w) ? 1.0/w : 1.0;
      max_value = fabs(x*w*points[0]+y*w*points[1]+z*w*points[2]+points[3]);
      for(point_count--; point_count--; /*empty iterator*/ )
      {
        points += point_stride;
        w = points[3];
        w = (0.0 != w) ? 1.0/w : 1.0;
        value = fabs(x*w*points[0]+y*w*points[1]+z*w*points[2]+points[3]);
        if ( value > max_value )
          max_value = value;
      }
    }
    else
    {
      max_value = fabs(x*points[0]+y*points[1]+z*points[2]+d);
      for(point_count--; point_count--; /*empty iterator*/ )
      {
        points += point_stride;
        value = fabs(x*points[0]+y*points[1]+z*points[2]+d);
        if ( value > max_value )
          max_value = value;
      }
    }
  }

  return max_value;
}